

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::
emplace_back<(anonymous_namespace)::Constructable&>
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,Constructable *args)

{
  pointer pCVar1;
  ulong uVar2;
  ulong uVar3;
  size_type sVar4;
  pointer pCVar5;
  reference pCVar6;
  reference extraout_RAX;
  uint uVar7;
  pointer ctx;
  int iVar8;
  int *piVar9;
  pointer pCVar10;
  long lVar11;
  ulong uVar12;
  pointer pCVar13;
  
  uVar2 = this->len;
  uVar3 = this->cap;
  pCVar13 = this->data_ + uVar2;
  if (uVar2 == uVar3) {
    if (uVar2 == 0xfffffffffffffff) {
      detail::throwLengthError();
    }
    uVar12 = uVar2 + 1;
    if (uVar2 + 1 < uVar3 * 2) {
      uVar12 = uVar3 * 2;
    }
    if (0xfffffffffffffff - uVar3 < uVar3) {
      uVar12 = 0xfffffffffffffff;
    }
    pCVar5 = (pointer)operator_new(uVar12 * 8);
    pCVar5[uVar2].constructed = true;
    pCVar5[uVar2].value = args->value;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 1;
    (anonymous_namespace)::Constructable::numCopyConstructorCalls =
         (anonymous_namespace)::Constructable::numCopyConstructorCalls + 1;
    ctx = this->data_;
    sVar4 = this->len;
    pCVar1 = ctx + sVar4;
    if (pCVar1 == pCVar13) {
      if (sVar4 != 0) {
        iVar8 = 0;
        lVar11 = 0;
        do {
          (&pCVar5->constructed)[lVar11] = true;
          *(undefined4 *)((long)&pCVar5->value + lVar11) =
               *(undefined4 *)((long)&ctx->value + lVar11);
          *(undefined4 *)((long)&ctx->value + lVar11) = 0;
          lVar11 = lVar11 + 8;
          iVar8 = iVar8 + -1;
        } while (sVar4 << 3 != lVar11);
        (anonymous_namespace)::Constructable::numConstructorCalls =
             (anonymous_namespace)::Constructable::numConstructorCalls - iVar8;
        (anonymous_namespace)::Constructable::numMoveConstructorCalls =
             (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar8;
      }
    }
    else {
      if (ctx != pCVar13) {
        iVar8 = 0;
        pCVar10 = pCVar5;
        do {
          pCVar10->constructed = true;
          pCVar10->value = ctx->value;
          ctx->value = 0;
          ctx = ctx + 1;
          pCVar10 = pCVar10 + 1;
          iVar8 = iVar8 + -1;
        } while (ctx != pCVar13);
        (anonymous_namespace)::Constructable::numConstructorCalls =
             (anonymous_namespace)::Constructable::numConstructorCalls - iVar8;
        (anonymous_namespace)::Constructable::numMoveConstructorCalls =
             (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar8;
      }
      piVar9 = &pCVar5[uVar2 + 1].value;
      ctx = (pointer)0x0;
      do {
        ((Constructable *)(piVar9 + -1))->constructed = true;
        *piVar9 = pCVar13->value;
        pCVar13->value = 0;
        pCVar13 = pCVar13 + 1;
        piVar9 = piVar9 + 2;
        uVar7 = (int)ctx - 1;
        ctx = (pointer)(ulong)uVar7;
      } while (pCVar13 != pCVar1);
      (anonymous_namespace)::Constructable::numConstructorCalls =
           (anonymous_namespace)::Constructable::numConstructorCalls - uVar7;
      (anonymous_namespace)::Constructable::numMoveConstructorCalls =
           (anonymous_namespace)::Constructable::numMoveConstructorCalls - uVar7;
    }
    cleanup(this,(EVP_PKEY_CTX *)ctx);
    this->len = this->len + 1;
    this->cap = uVar12;
    this->data_ = pCVar5;
    pCVar6 = extraout_RAX;
  }
  else {
    pCVar13->constructed = true;
    pCVar6 = (reference)(ulong)(uint)args->value;
    pCVar13->value = args->value;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 1;
    (anonymous_namespace)::Constructable::numCopyConstructorCalls =
         (anonymous_namespace)::Constructable::numCopyConstructorCalls + 1;
    this->len = uVar2 + 1;
  }
  return pCVar6;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }